

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O2

void Scl_LibertyReadLoadUnit(Scl_Tree_t *p,Vec_Str_t *vOut)

{
  int iVar1;
  Scl_Item_t *pSVar2;
  char *pcVar3;
  int Val;
  int *piVar4;
  double dVar5;
  
  piVar4 = &p->pItems->Child;
  Val = 0xc;
  do {
    pSVar2 = Scl_LibertyItem(p,*piVar4);
    if (pSVar2 == (Scl_Item_t *)0x0) {
LAB_0035268c:
      puts(
          "Libery parser cannot read \"capacitive_load_unit\". Assuming   capacitive_load_unit(1, pf)."
          );
      Vec_StrPutF_(vOut,1.0);
LAB_003526a8:
      Vec_StrPutI_(vOut,Val);
      return;
    }
    iVar1 = Scl_LibertyCompare(p,pSVar2->Key,"capacitive_load_unit");
    if (iVar1 == 0) {
      pcVar3 = Scl_LibertyReadString(p,pSVar2->Head);
      pcVar3 = strtok(pcVar3," \t\n\r\\\",");
      dVar5 = atof(pcVar3);
      pcVar3 = strtok((char *)0x0," \t\n\r\\\",");
      Vec_StrPutF_(vOut,(float)dVar5);
      if (pcVar3 != (char *)0x0) {
        if (*pcVar3 == 'f') {
          if ((pcVar3[1] == 'f') && (pcVar3[2] == '\0')) {
            Val = 0xf;
            goto LAB_003526a8;
          }
        }
        else if (((*pcVar3 == 'p') && (pcVar3[1] == 'f')) && (pcVar3[2] == '\0')) goto LAB_003526a8;
      }
      goto LAB_0035268c;
    }
    piVar4 = &pSVar2->Next;
  } while( true );
}

Assistant:

void Scl_LibertyReadLoadUnit( Scl_Tree_t * p, Vec_Str_t * vOut )
{
    Scl_Item_t * pItem;
    Scl_ItemForEachChildName( p, Scl_LibertyRoot(p), pItem, "capacitive_load_unit" )
    {
        // expecting (1.00,ff) or (1, pf) ... 12 or 15 for 'pf' or 'ff'
        char * pHead   = Scl_LibertyReadString(p, pItem->Head);
        float First    = atof(strtok(pHead, " \t\n\r\\\","));
        char * pSecond = strtok(NULL, " \t\n\r\\\",");
        Vec_StrPutF_( vOut, First );
        if ( pSecond && !strcmp(pSecond, "pf") )
            Vec_StrPutI_( vOut, 12 );
        else if ( pSecond && !strcmp(pSecond, "ff") )
            Vec_StrPutI_( vOut, 15 );
        else break;
        return;
    }
    printf( "Libery parser cannot read \"capacitive_load_unit\". Assuming   capacitive_load_unit(1, pf).\n" );
    Vec_StrPutF_( vOut, 1.0 );
    Vec_StrPutI_( vOut, 12 );
}